

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_union_table(flatcc_union_verifier_descriptor_t *ud,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  uint uVar2;
  flatcc_table_verifier_descriptor_t local_28;
  ulong uVar3;
  
  local_28.buf = ud->buf;
  local_28.end = ud->end;
  local_28.ttl = ud->ttl + -1;
  if (local_28.ttl == 0) {
    iVar1 = 3;
  }
  else {
    local_28.table = ud->offset + ud->base;
    iVar1 = 0xf;
    if ((ud->base < local_28.table) &&
       ((local_28.table & 3) == 0 && (ulong)local_28.table + 4 <= (ulong)local_28.end)) {
      uVar2 = local_28.table - *(int *)((long)local_28.buf + (ulong)local_28.table);
      uVar3 = (ulong)uVar2;
      iVar1 = 0x1d;
      if ((uVar2 & 1) == 0 && -1 < (int)uVar2) {
        iVar1 = 0x1b;
        if (uVar3 + 2 <= (ulong)local_28.end) {
          local_28.vsize = *(ushort *)((long)local_28.buf + uVar3);
          iVar1 = 0x1e;
          if (((local_28.vsize & 1) == 0 && uVar2 + local_28.vsize <= local_28.end) &&
             (iVar1 = 0x1c, 3 < local_28.vsize)) {
            local_28.tsize = *(ushort *)((long)local_28.buf + uVar3 + 2);
            iVar1 = 0x14;
            if ((uint)local_28.tsize <= local_28.end - local_28.table) {
              local_28.vtable = (void *)(uVar3 + (long)local_28.buf);
              iVar1 = (*tvf)(&local_28);
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_union_table(flatcc_union_verifier_descriptor_t *ud, flatcc_table_verifier_f *tvf)
{
    return verify_table(ud->buf, ud->end, ud->base, ud->offset, ud->ttl, tvf);
}